

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

int64_t fiobj_ary_find(FIOBJ ary,FIOBJ data)

{
  size_t sVar1;
  intptr_t iVar2;
  
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,(fiobj_type_enum)data);
    if (sVar1 != 0) {
      iVar2 = fio_ary___find((fio_ary___s *)(ary + 8),data);
      return iVar2;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xcb,"int64_t fiobj_ary_find(FIOBJ, FIOBJ)");
}

Assistant:

int64_t fiobj_ary_find(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  return (int64_t)fio_ary___find(&obj2ary(ary)->ary, data);
}